

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DLevelScript::Unlink(DLevelScript *this)

{
  DLevelScript *pDVar1;
  DLevelScript *pDVar2;
  DACSThinker *pointing;
  
  pointing = GC::ReadBarrier<DACSThinker>((DACSThinker **)&DACSThinker::ActiveThinker);
  if (pointing->LastScript == this) {
    pDVar1 = this->prev;
    pointing->LastScript = pDVar1;
    GC::WriteBarrier((DObject *)pointing,&pDVar1->super_DObject);
  }
  if (pointing->Scripts == this) {
    pDVar1 = this->next;
    pointing->Scripts = pDVar1;
    GC::WriteBarrier((DObject *)pointing,&pDVar1->super_DObject);
  }
  pDVar1 = this->prev;
  if (pDVar1 != (DLevelScript *)0x0) {
    pDVar2 = this->next;
    pDVar1->next = pDVar2;
    GC::WriteBarrier(&pDVar1->super_DObject,&pDVar2->super_DObject);
  }
  pDVar1 = this->next;
  if (pDVar1 != (DLevelScript *)0x0) {
    pDVar2 = this->prev;
    pDVar1->prev = pDVar2;
    GC::WriteBarrier(&pDVar1->super_DObject,&pDVar2->super_DObject);
    return;
  }
  return;
}

Assistant:

void DLevelScript::Unlink ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	if (controller->LastScript == this)
	{
		controller->LastScript = prev;
		GC::WriteBarrier(controller, prev);
	}
	if (controller->Scripts == this)
	{
		controller->Scripts = next;
		GC::WriteBarrier(controller, next);
	}
	if (prev)
	{
		prev->next = next;
		GC::WriteBarrier(prev, next);
	}
	if (next)
	{
		next->prev = prev;
		GC::WriteBarrier(next, prev);
	}
}